

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

void __thiscall
UnicodeFullTest_string_cast_Test<std::pair<char16_t,_char32_t>_>::TestBody
          (UnicodeFullTest_string_cast_Test<std::pair<char16_t,_char32_t>_> *this)

{
  size_t this_00;
  char16_t *pcVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *rhs;
  char32_t (*in_RDX) [5];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *in_string;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_string_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs;
  AssertHelper local_80 [8];
  long *local_78;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_70;
  AssertionResult gtest_ar_;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> abcd_string_view;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> abcd_str;
  
  jessilib::string_cast<char16_t,char32_t[5]>(&abcd_str,(jessilib *)L"ABCD",in_RDX);
  abcd_string_view._M_len = abcd_str._M_string_length;
  abcd_string_view._M_str = abcd_str._M_dataplus._M_p;
  jessilib::string_cast<char32_t,std::__cxx11::u16string>(&local_70,(jessilib *)&abcd_str,in_string)
  ;
  gtest_ar_.success_ = jessilib::equals<char16_t,char32_t>(&abcd_str,&local_70);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u32string::~u32string((u32string *)&local_70);
  rhs = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
        abcd_str._M_string_length;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_70,&gtest_ar_.success_,
               "equals(abcd_str, string_cast<typename TypeParam::second_type>(abcd_str))","false");
    rhs = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)0x9d;
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x9d,(char *)local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    std::__cxx11::string::~string((string *)&local_70);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = jessilib::is_valid<std::__cxx11::u16string>(&abcd_str);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_70,&gtest_ar_.success_,"is_valid(abcd_str)","false");
    rhs = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)0x9e;
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x9e,(char *)local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    std::__cxx11::string::~string((string *)&local_70);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pcVar1 = abcd_string_view._M_str;
  this_00 = abcd_string_view._M_len;
  jessilib::string_cast<char32_t,std::basic_string_view<char16_t,std::char_traits<char16_t>>>
            (&local_70,(jessilib *)&abcd_string_view,in_string_00);
  lhs._M_str = (char16_t *)&local_70;
  lhs._M_len = (size_t)pcVar1;
  gtest_ar_.success_ = jessilib::equals<char16_t,char32_t>((jessilib *)this_00,lhs,rhs);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::u32string::~u32string((u32string *)&local_70);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_70,&gtest_ar_.success_,
               "equals(abcd_string_view, string_cast<typename TypeParam::second_type>(abcd_string_view))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xa1,(char *)local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    std::__cxx11::string::~string((string *)&local_70);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       jessilib::is_valid<std::basic_string_view<char16_t,std::char_traits<char16_t>>>
                 (&abcd_string_view);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_70,&gtest_ar_.success_,"is_valid(abcd_string_view)","false"
              );
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xa2,(char *)local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    std::__cxx11::string::~string((string *)&local_70);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::__cxx11::u16string::~u16string((u16string *)&abcd_str);
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, string_cast) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");
	std::basic_string_view<typename TypeParam::first_type> abcd_string_view = abcd_str;

	EXPECT_TRUE(equals(abcd_str,
		string_cast<typename TypeParam::second_type>(abcd_str)));
	EXPECT_TRUE(is_valid(abcd_str));

	EXPECT_TRUE(equals(abcd_string_view,
		string_cast<typename TypeParam::second_type>(abcd_string_view)));
	EXPECT_TRUE(is_valid(abcd_string_view));
}